

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O1

FTexture * PatchTexture_TryCreate(FileReader *file,int lumpnum)

{
  short sVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  short *psVar5;
  FPatchTexture *this;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  patch_t header;
  patch_t local_38;
  
  if (0xc < file->Length) {
    psVar5 = (short *)operator_new__(file->Length);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,psVar5,file->Length);
    sVar1 = *psVar5;
    if ((ushort)(sVar1 - 1U) < 0x800 && (ushort)(psVar5[1] - 1U) < 0x800) {
      uVar4 = (uint)sVar1;
      lVar2 = file->Length;
      lVar6 = lVar2 + 3;
      if (-1 < lVar2) {
        lVar6 = lVar2;
      }
      if (0 < sVar1 && (long)(ulong)uVar4 < lVar6 >> 2) {
        bVar8 = true;
        uVar7 = 0;
        do {
          if (*(uint *)(psVar5 + uVar7 * 2 + 4) == uVar4 * 4 + 8) {
            bVar8 = false;
LAB_004ff665:
            bVar3 = true;
          }
          else {
            if (*(uint *)(psVar5 + uVar7 * 2 + 4) < (uint)file->Length) goto LAB_004ff665;
            operator_delete__(psVar5);
            bVar3 = false;
          }
          if (!bVar3) {
            return (FTexture *)0x0;
          }
          uVar7 = uVar7 + 1;
          if (uVar4 == uVar7) {
            operator_delete__(psVar5);
            if (bVar8) {
              return (FTexture *)0x0;
            }
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_38,2);
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_38.height,2);
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_38.leftoffset,2);
            (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_38.topoffset,2);
            this = (FPatchTexture *)operator_new(0x70);
            FPatchTexture::FPatchTexture(this,lumpnum,&local_38);
            return &this->super_FTexture;
          }
        } while( true );
      }
    }
    operator_delete__(psVar5);
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture *PatchTexture_TryCreate(FileReader & file, int lumpnum)
{
	patch_t header;

	if (!CheckIfPatch(file)) return NULL;
	file.Seek(0, SEEK_SET);
	file >> header.width >> header.height >> header.leftoffset >> header.topoffset;
	return new FPatchTexture(lumpnum, &header);
}